

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O2

void __thiscall pmx::PmxRigidBody::Read(PmxRigidBody *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  uint8_t in_CL;
  string local_40;
  
  ReadString_abi_cxx11_(&local_40,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ReadString_abi_cxx11_(&local_40,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->rigid_body_english_name,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->target_bone = iVar1;
  std::istream::read((char *)stream,(long)&this->group);
  std::istream::read((char *)stream,(long)&this->mask);
  std::istream::read((char *)stream,(long)&this->shape);
  std::istream::read((char *)stream,(long)this->size);
  std::istream::read((char *)stream,(long)this->position);
  std::istream::read((char *)stream,(long)this->orientation);
  std::istream::read((char *)stream,(long)&this->mass);
  std::istream::read((char *)stream,(long)&this->move_attenuation);
  std::istream::read((char *)stream,(long)&this->rotation_attenuation);
  std::istream::read((char *)stream,(long)&this->repulsion);
  std::istream::read((char *)stream,(long)&this->friction);
  std::istream::read((char *)stream,(long)&this->physics_calc_type);
  return;
}

Assistant:

void PmxRigidBody::Read(std::istream *stream, PmxSetting *setting)
	{
		this->rigid_body_name = ReadString(stream, setting->encoding);
		this->rigid_body_english_name = ReadString(stream, setting->encoding);
		this->target_bone = ReadIndex(stream, setting->bone_index_size);
		stream->read((char*) &this->group, sizeof(uint8_t));
		stream->read((char*) &this->mask, sizeof(uint16_t));
		stream->read((char*) &this->shape, sizeof(uint8_t));
		stream->read((char*) this->size, sizeof(float) * 3);
		stream->read((char*) this->position, sizeof(float) * 3);
		stream->read((char*) this->orientation, sizeof(float) * 3);
		stream->read((char*) &this->mass, sizeof(float));
		stream->read((char*) &this->move_attenuation, sizeof(float));
		stream->read((char*) &this->rotation_attenuation, sizeof(float));
		stream->read((char*) &this->repulsion, sizeof(float));
		stream->read((char*) &this->friction, sizeof(float));
		stream->read((char*) &this->physics_calc_type, sizeof(uint8_t));
	}